

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::tracker_scrape_response
          (torrent *this,tracker_request *req,int complete,int incomplete,int downloaded,int param_5
          )

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  int iVar5;
  announce_entry *this_00;
  announce_endpoint *paVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  protocol_version hash_version;
  endpoint local_endpoint;
  protocol_version local_61;
  int local_60;
  int local_5c;
  data_union local_58;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> local_30;
  
  auVar7[0] = -((char)(req->info_hash).m_number._M_elems[0] ==
               (char)(this->m_info_hash).v1.m_number._M_elems[0]);
  auVar7[1] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 1) ==
               *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 1));
  auVar7[2] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 2) ==
               *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 2));
  auVar7[3] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 3) ==
               *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 3));
  auVar7[4] = -((char)(req->info_hash).m_number._M_elems[1] ==
               (char)(this->m_info_hash).v1.m_number._M_elems[1]);
  auVar7[5] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 5) ==
               *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 5));
  auVar7[6] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 6) ==
               *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 6));
  auVar7[7] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 7) ==
               *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 7));
  auVar7[8] = -((char)(req->info_hash).m_number._M_elems[2] ==
               (char)(this->m_info_hash).v1.m_number._M_elems[2]);
  auVar7[9] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 9) ==
               *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 9));
  auVar7[10] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 10) ==
                *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 10));
  auVar7[0xb] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 0xb) ==
                 *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xb));
  auVar7[0xc] = -((char)(req->info_hash).m_number._M_elems[3] ==
                 (char)(this->m_info_hash).v1.m_number._M_elems[3]);
  auVar7[0xd] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 0xd) ==
                 *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xd));
  auVar7[0xe] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 0xe) ==
                 *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xe));
  auVar7[0xf] = -(*(char *)((long)(req->info_hash).m_number._M_elems + 0xf) ==
                 *(char *)((long)(this->m_info_hash).v1.m_number._M_elems + 0xf));
  uVar2 = (this->m_info_hash).v1.m_number._M_elems[4];
  uVar3 = (req->info_hash).m_number._M_elems[4];
  auVar8[0] = -((char)uVar3 == (char)uVar2);
  auVar8[1] = -((char)(uVar3 >> 8) == (char)(uVar2 >> 8));
  auVar8[2] = -((char)(uVar3 >> 0x10) == (char)(uVar2 >> 0x10));
  auVar8[3] = -((char)(uVar3 >> 0x18) == (char)(uVar2 >> 0x18));
  auVar8[4] = 0xff;
  auVar8[5] = 0xff;
  auVar8[6] = 0xff;
  auVar8[7] = 0xff;
  auVar8[8] = 0xff;
  auVar8[9] = 0xff;
  auVar8[10] = 0xff;
  auVar8[0xb] = 0xff;
  auVar8[0xc] = 0xff;
  auVar8[0xd] = 0xff;
  auVar8[0xe] = 0xff;
  auVar8[0xf] = 0xff;
  auVar8 = auVar8 & auVar7;
  local_61 = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) != 0xffff;
  local_60 = incomplete;
  local_5c = complete;
  this_00 = tracker_list::find_tracker(&this->m_trackers,&req->url);
  local_58._8_4_ = 0;
  local_58._12_4_ = 0;
  local_58._16_4_ = 0;
  local_58._20_8_ = 0;
  local_58._0_8_ = 2;
  if (this_00 != (announce_entry *)0x0) {
    paVar6 = announce_entry::find_endpoint(this_00,&req->outgoing_socket);
    if (paVar6 != (announce_endpoint *)0x0) {
      local_58._0_8_ = *(undefined8 *)&(paVar6->local_endpoint).impl_.data_;
      uVar4 = *(undefined8 *)((long)&(paVar6->local_endpoint).impl_.data_ + 8);
      local_58._20_8_ = *(undefined8 *)((long)&(paVar6->local_endpoint).impl_.data_ + 0x14);
      local_58._16_4_ =
           (undefined4)
           ((ulong)*(undefined8 *)((long)&(paVar6->local_endpoint).impl_.data_ + 0xc) >> 0x20);
      local_58._8_4_ = (undefined4)uVar4;
      local_58._12_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      if (-1 < local_60) {
        (paVar6->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
        [local_61].scrape_incomplete = local_60;
      }
      if (-1 < local_5c) {
        (paVar6->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
        [local_61].scrape_complete = local_5c;
      }
      if (-1 < downloaded) {
        (paVar6->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems
        [local_61].scrape_downloaded = downloaded;
      }
      update_scrape_state(this);
    }
  }
  iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  if (((*(uint *)(CONCAT44(extraout_var,iVar5) + 0x68) & 0x10) != 0) ||
     (req->triggered_manually == true)) {
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)&stack0xffffffffffffffc8);
    alert_manager::
    emplace_alert<libtorrent::scrape_reply_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int_const&,int_const&,std::__cxx11::string_const&,libtorrent::protocol_version_const&>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar5),
               (torrent_handle *)&stack0xffffffffffffffc8,
               (basic_endpoint<boost::asio::ip::tcp> *)&local_58.base,&local_60,&local_5c,&req->url,
               &local_61);
    if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
         )local_30._M_head_impl !=
        (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
         )0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)local_30._M_head_impl + 0xc);
        iVar5 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = *(int *)((long)local_30._M_head_impl + 0xc);
        *(int *)((long)local_30._M_head_impl + 0xc) = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (**(code **)(*(long *)local_30._M_head_impl + 0x18))();
      }
    }
  }
  return;
}

Assistant:

void torrent::tracker_scrape_response(tracker_request const& req
		, int const complete, int const incomplete, int const downloaded, int /* downloaders */)
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;
		TORRENT_ASSERT(req.kind & tracker_request::scrape_request);

		protocol_version const hash_version = req.info_hash == m_info_hash.v1
			? protocol_version::V1 : protocol_version::V2;

		aux::announce_entry* ae = m_trackers.find_tracker(req.url);
		tcp::endpoint local_endpoint;
		if (ae)
		{
			auto* aep = ae->find_endpoint(req.outgoing_socket);
			if (aep)
			{
				local_endpoint = aep->local_endpoint;
				if (incomplete >= 0) aep->info_hashes[hash_version].scrape_incomplete = incomplete;
				if (complete >= 0) aep->info_hashes[hash_version].scrape_complete = complete;
				if (downloaded >= 0) aep->info_hashes[hash_version].scrape_downloaded = downloaded;

				update_scrape_state();
			}
		}

		// if this was triggered manually we need to post this unconditionally,
		// since the client expects a response from its action, regardless of
		// whether all tracker events have been enabled by the alert mask
		if (m_ses.alerts().should_post<scrape_reply_alert>()
			|| req.triggered_manually)
		{
			m_ses.alerts().emplace_alert<scrape_reply_alert>(
				get_handle(), local_endpoint, incomplete, complete, req.url, hash_version);
		}
	}